

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

string * __thiscall
Session::receive(string *__return_storage_ptr__,Session *this,string *message_name,
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *arguments)

{
  string *str;
  bool bVar1;
  __type _Var2;
  undefined8 *puVar3;
  char *pcVar4;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  StringInstance local_a0;
  
  bVar1 = std::operator==(message_name,"close");
  if (bVar1) {
    this->_is_connected = false;
LAB_0015afb1:
    std::__cxx11::string::string((string *)__return_storage_ptr__,"null",(allocator *)&local_a0);
    return __return_storage_ptr__;
  }
  bVar1 = std::operator==(message_name,"authenticateWithPassword:");
  if (bVar1) {
    str = (arguments->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
    if ((long)(arguments->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish - (long)str == 0x20) {
      bVar1 = Grammar::is_string_value(str);
      if (bVar1) {
        StringInstance::StringInstance
                  (&local_a0,
                   (arguments->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start);
        StringInstance::value_abi_cxx11_(&local_e0,&local_a0);
        std::__cxx11::string::string((string *)&local_c0,(string *)Server::_instance);
        _Var2 = std::operator==(&local_e0,&local_c0);
        std::__cxx11::string::~string((string *)&local_c0);
        std::__cxx11::string::~string((string *)&local_e0);
        StringInstance::~StringInstance(&local_a0);
        if (_Var2) {
          this->_is_authenticated = true;
          goto LAB_0015afb1;
        }
        puVar3 = (undefined8 *)__cxa_allocate_exception(8);
        pcVar4 = "AuthenticationError: wrong password.";
      }
      else {
        puVar3 = (undefined8 *)__cxa_allocate_exception(8);
        pcVar4 = "RuntimeError: invalid argument.";
      }
    }
    else {
      puVar3 = (undefined8 *)__cxa_allocate_exception(8);
      pcVar4 = "RuntimeError: wrong number of arguments.";
    }
  }
  else {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    pcVar4 = "RuntimeError: invalid message.";
  }
  *puVar3 = pcVar4;
  __cxa_throw(puVar3,&char_const*::typeinfo,0);
}

Assistant:

std::string Session::receive(const std::string& message_name, const std::vector<std::string>& arguments) {
    if (message_name == "close") {
        _is_connected = false;
        return "null";
    }
    if (message_name == "authenticateWithPassword:") {
        if (arguments.size() != 1)
            throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
        if (!Grammar::is_string_value(arguments[0]))
            throw EXC_INVALID_ARGUMENT;
        if (StringInstance(arguments[0]).value() == Server::get_instance()->get_password()) {
            _is_authenticated = true;
            return "null";
        }
        throw EXC_WRONG_PASSWORD;
    }
    throw EXC_INVALID_MESSAGE;
}